

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

bool __thiscall
Clasp::mt::SharedLitsClause::isReverseReason
          (SharedLitsClause *this,Solver *s,Literal p,uint32 maxL,uint32 maxN)

{
  Literal p_00;
  SharedLiterals *pSVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  pSVar1 = (this->super_ClauseHead).field_0.shared_;
  uVar5 = (ulong)(pSVar1->size_type_ & 0xfffffffc);
  uVar4 = 0;
  for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 4) {
    p_00.rep_ = *(uint32 *)((long)&pSVar1[1].refCount_.super___atomic_base<int>._M_i + uVar3);
    if (1 < (p_00.rep_ ^ p.rep_)) {
      bVar2 = isRevLit(s,p_00,maxL);
      if (!bVar2) break;
      if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf +
                    (ulong)(*(uint *)((long)&pSVar1[1].refCount_.super___atomic_base<int>._M_i +
                                     uVar3) & 0xfffffffc)) & 0xc) == 0) {
        uVar4 = uVar4 + 1;
        if (maxN < uVar4) break;
      }
    }
  }
  return uVar5 == uVar3;
}

Assistant:

bool SharedLitsClause::isReverseReason(const Solver& s, Literal p, uint32 maxL, uint32 maxN) {
	uint32 notSeen = 0;
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		if (*r == p) continue;
		if (!isRevLit(s, *r, maxL)) return false;
		if (!s.seen(r->var()) && ++notSeen > maxN) return false;
	}
	return true;
}